

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetMetricStreamerReadData
          (zet_metric_streamer_handle_t hMetricStreamer,uint32_t maxReportCount,size_t *pRawDataSize
          ,uint8_t *pRawData)

{
  zet_pfnMetricStreamerReadData_t pfnReadData;
  ze_result_t result;
  uint8_t *pRawData_local;
  size_t *pRawDataSize_local;
  uint32_t maxReportCount_local;
  zet_metric_streamer_handle_t hMetricStreamer_local;
  
  pfnReadData._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c8f8 != (code *)0x0) {
    pfnReadData._4_4_ = (*DAT_0011c8f8)(hMetricStreamer,maxReportCount,pRawDataSize,pRawData);
  }
  return pfnReadData._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricStreamerReadData(
        zet_metric_streamer_handle_t hMetricStreamer,   ///< [in] handle of the metric streamer
        uint32_t maxReportCount,                        ///< [in] the maximum number of reports the application wants to receive.
                                                        ///< if `UINT32_MAX`, then function will retrieve all reports available
        size_t* pRawDataSize,                           ///< [in,out] pointer to size in bytes of raw data requested to read.
                                                        ///< if size is zero, then the driver will update the value with the total
                                                        ///< size in bytes needed for all reports available.
                                                        ///< if size is non-zero, then driver will only retrieve the number of
                                                        ///< reports that fit into the buffer.
                                                        ///< if size is larger than size needed for all reports, then driver will
                                                        ///< update the value with the actual size needed.
        uint8_t* pRawData                               ///< [in,out][optional][range(0, *pRawDataSize)] buffer containing streamer
                                                        ///< reports in raw format
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnReadData = context.zetDdiTable.MetricStreamer.pfnReadData;
        if( nullptr != pfnReadData )
        {
            result = pfnReadData( hMetricStreamer, maxReportCount, pRawDataSize, pRawData );
        }
        else
        {
            // generic implementation
        }

        return result;
    }